

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseObject<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar1;
  bool bVar2;
  long lVar3;
  Member *pMVar5;
  uint uVar6;
  char *pcVar4;
  
  is->src_ = is->src_ + 1;
  bVar2 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::StartObject(handler);
  if (bVar2) {
    SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,is);
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    pcVar4 = is->src_;
    if (*pcVar4 == '}') {
      is->src_ = pcVar4 + 1;
      pcVar4 = (handler->stack_).stackTop_;
      pcVar4[-8] = '\0';
      pcVar4[-7] = '\0';
      pcVar4[-6] = '\0';
      pcVar4[-5] = '\0';
      pcVar4[-4] = '\0';
      pcVar4[-3] = '\0';
      pcVar4[-2] = '\x03';
      pcVar4[-1] = '\0';
      pcVar4[-0x10] = '\0';
      pcVar4[-0xf] = '\0';
      pcVar4[-0xe] = '\0';
      pcVar4[-0xd] = '\0';
      pcVar4[-0xc] = '\0';
      pcVar4[-0xb] = '\0';
      pcVar4[-10] = '\0';
      pcVar4[-9] = '\0';
      return;
    }
    if (*pcVar4 == '\"') {
      uVar6 = 0;
      do {
        ParseString<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler,true);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                  (this,is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pcVar4 = is->src_;
        if (*pcVar4 != ':') {
          lVar3 = (long)pcVar4 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 5;
          goto LAB_00139240;
        }
        is->src_ = pcVar4 + 1;
        SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                  (this,is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        ParseValue<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                  (this,is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pcVar4 = is->src_;
        if (*pcVar4 != ',') {
          if (*pcVar4 == '}') {
            is->src_ = pcVar4 + 1;
            uVar6 = uVar6 + 1;
            pMVar1 = handler->allocator_;
            pcVar4 = (handler->stack_).stackTop_;
            pMVar5 = (Member *)(pcVar4 + (ulong)uVar6 * -0x20);
            (handler->stack_).stackTop_ = (char *)pMVar5;
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::SetObjectRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                            *)(pcVar4 + (ulong)uVar6 * -0x20 + -0x10),pMVar5,uVar6,pMVar1);
            return;
          }
          lVar3 = (long)pcVar4 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 6;
          goto LAB_00139240;
        }
        is->src_ = pcVar4 + 1;
        SkipWhitespaceAndComments<160u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
                  (this,is);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        pcVar4 = is->src_;
        uVar6 = uVar6 + 1;
        if (*pcVar4 == '}') {
          pMVar1 = handler->allocator_;
          pcVar4 = (handler->stack_).stackTop_;
          pMVar5 = (Member *)(pcVar4 + (ulong)uVar6 * -0x20);
          (handler->stack_).stackTop_ = (char *)pMVar5;
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::SetObjectRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)(pcVar4 + (ulong)uVar6 * -0x20 + -0x10),pMVar5,uVar6,pMVar1);
          is->src_ = is->src_ + 1;
          return;
        }
      } while (*pcVar4 == '\"');
    }
    lVar3 = (long)pcVar4 - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 4;
  }
  else {
    lVar3 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
  }
LAB_00139240:
  *(long *)(this + 0x38) = lVar3;
  return;
}

Assistant:

void ParseObject(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == '{');
        is.Take();  // Skip '{'

        if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

        if (Consume(is, '}')) {
            if (RAPIDJSON_UNLIKELY(!handler.EndObject(0)))  // empty object
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
            return;
        }

        for (SizeType memberCount = 0;;) {
            if (RAPIDJSON_UNLIKELY(is.Peek() != '"'))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissName, is.Tell());

            ParseString<parseFlags>(is, handler, true);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            if (RAPIDJSON_UNLIKELY(!Consume(is, ':')))
                RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissColon, is.Tell());

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            SkipWhitespaceAndComments<parseFlags>(is);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

            ++memberCount;

            switch (is.Peek()) {
                case ',':
                    is.Take();
                    SkipWhitespaceAndComments<parseFlags>(is);
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    break;
                case '}':
                    is.Take();
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    return;
                default:
                    RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissCommaOrCurlyBracket, is.Tell()); break; // This useless break is only for making warning and coverage happy
            }

            if (parseFlags & kParseTrailingCommasFlag) {
                if (is.Peek() == '}') {
                    if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
                        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
                    is.Take();
                    return;
                }
            }
        }
    }